

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable *table)

{
  long lVar1;
  ImGuiTableColumn *pIVar2;
  
  lVar1 = (long)table->ColumnsCount;
  if (0 < lVar1) {
    pIVar2 = (table->Columns).Data;
    do {
      if ((table->Columns).DataEnd <= pIVar2) {
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui_internal.h"
                      ,0x20b,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
      }
      if (pIVar2->IsEnabled == true) {
        pIVar2->AutoFitQueue = '\x02';
        pIVar2->CannotSkipItemsQueue = '\x01';
      }
      pIVar2 = pIVar2 + 1;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoAll(ImGuiTable* table)
{
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled)
            continue;
        column->CannotSkipItemsQueue = (1 << 0);
        column->AutoFitQueue = (1 << 1);
    }
}